

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<double> * __thiscall
tinyusdz::XformOp::get_value<double>
          (optional<double> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  storage_t<double> sVar2;
  PrimVar *this_00;
  double value;
  optional<double> local_30;
  
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<double>(this_00,t,interp,(double *)&local_30);
    if (bVar1) {
      sVar2._1_7_ = local_30._1_7_;
      sVar2._0_1_ = local_30.has_value_;
    }
    else {
      sVar2 = (storage_t<double>)0x0;
    }
    __return_storage_ptr__->has_value_ = bVar1;
    __return_storage_ptr__->contained = sVar2;
  }
  else {
    primvar::PrimVar::get_value<double>(&local_30,this_00);
    __return_storage_ptr__->has_value_ = local_30.has_value_;
    if (local_30.has_value_ == true) {
      __return_storage_ptr__->contained = local_30.contained;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }